

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O2

int SoapSendAction(char *action_url,char *service_type,IXML_Document *action_node,
                  IXML_Document **response_node)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *action;
  size_t sVar4;
  undefined8 in_stack_fffffffffffffc40;
  undefined4 uVar5;
  int upnp_error_code;
  memptr name;
  membuffer responsename;
  char *upnp_error_str;
  membuffer request;
  uri_type url;
  http_parser_t response;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffc40 >> 0x20);
  *response_node = (IXML_Document *)0x0;
  UpnpPrintf(UPNP_INFO,SOAP,".upnp/src/soap/soap_ctrlpt.c",0x228,"Inside SoapSendAction():");
  membuffer_init(&request);
  membuffer_init(&responsename);
  action = (char *)ixmlPrintNode(action_node);
  iVar3 = -0x68;
  bVar1 = true;
  if (action != (char *)0x0) {
    iVar2 = get_action_name(action,&name);
    if (iVar2 == 0) {
      sVar4 = strlen(action_url);
      iVar2 = http_FixStrUrl(action_url,sVar4,&url);
      if (iVar2 == 0) {
        UpnpPrintf(UPNP_INFO,SOAP,".upnp/src/soap/soap_ctrlpt.c",0x241,"path=%.*s, hostport=%.*s\n",
                   (ulong)(uint)url.pathquery.size,url.pathquery.buff,
                   CONCAT44(uVar5,(undefined4)url.hostport.text.size),url.hostport.text.buff);
        sVar4 = strlen(action);
        request.size_inc = 0x32;
        iVar2 = http_MakeMessage(&request,1,1,"qNssssbscUcbbb",0xb,&url,sVar4 + 0xa2,
                                 ContentTypeHeader,"SOAPACTION: \"",service_type,"#",name.buf._0_4_,
                                 (undefined4)name.length,"\"",
                                 "<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">\r\n<s:Body>"
                                 ,0x86,action,sVar4,"</s:Body>\r\n</s:Envelope>\r\n\r\n",0x1c);
        if (iVar2 == 0) {
          iVar2 = soap_request_and_response(&request,&url,&response);
          if (iVar2 == 0) {
            iVar2 = membuffer_append(&responsename,(void *)CONCAT44(name.buf._4_4_,name.buf._0_4_),
                                     CONCAT44(name.length._4_4_,(undefined4)name.length));
            if (iVar2 == 0) {
              iVar2 = membuffer_append_str(&responsename,"Response");
              bVar1 = false;
              if (iVar2 != 0) goto LAB_0012454b;
              iVar3 = get_response_value(&response.msg,1,responsename.buf,&upnp_error_code,
                                         (IXML_Node **)response_node,&upnp_error_str);
              if (iVar3 == 1) {
                iVar3 = 0;
                goto LAB_0012454b;
              }
              if (iVar3 == 3) {
                iVar3 = upnp_error_code;
              }
            }
            bVar1 = false;
          }
          else {
            bVar1 = false;
            iVar3 = iVar2;
          }
        }
      }
      else {
        iVar3 = -0x6c;
      }
    }
    else {
      iVar3 = -0x73;
    }
  }
LAB_0012454b:
  ixmlFreeDOMString(action);
  membuffer_destroy(&request);
  membuffer_destroy(&responsename);
  if (!bVar1) {
    httpmsg_destroy(&response.msg);
  }
  return iVar3;
}

Assistant:

int SoapSendAction(char *action_url,
	char *service_type,
	IXML_Document *action_node,
	IXML_Document **response_node)
{
	char *action_str = NULL;
	memptr name;
	membuffer request;
	membuffer responsename;
	int err_code;
	int ret_code;
	http_parser_t response;
	uri_type url;
	int upnp_error_code;
	char *upnp_error_str;
	int got_response = 0;

	off_t content_length;
	const char *xml_start =
		"<s:Envelope "
		"xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" "
		"s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/"
		"\">\r\n"
		"<s:Body>";
	const char *xml_end = "</s:Body>\r\n"
			      "</s:Envelope>\r\n\r\n";
	size_t xml_start_len;
	size_t xml_end_len;
	size_t action_str_len;

	*response_node = NULL; /* init */

	err_code = UPNP_E_OUTOF_MEMORY; /* default error */

	UpnpPrintf(UPNP_INFO,
		SOAP,
		__FILE__,
		__LINE__,
		"Inside SoapSendAction():");
	/* init */
	membuffer_init(&request);
	membuffer_init(&responsename);

	/* print action */
	action_str = ixmlPrintNode((IXML_Node *)action_node);
	if (action_str == NULL) {
		goto error_handler;
	}
	/* get action name */
	if (get_action_name(action_str, &name) != 0) {
		err_code = UPNP_E_INVALID_ACTION;
		goto error_handler;
	}
	/* parse url */
	if (http_FixStrUrl(action_url, strlen(action_url), &url) != 0) {
		err_code = UPNP_E_INVALID_URL;
		goto error_handler;
	}

	UpnpPrintf(UPNP_INFO,
		SOAP,
		__FILE__,
		__LINE__,
		"path=%.*s, hostport=%.*s\n",
		(int)url.pathquery.size,
		url.pathquery.buff,
		(int)url.hostport.text.size,
		url.hostport.text.buff);

	xml_start_len = strlen(xml_start);
	xml_end_len = strlen(xml_end);
	action_str_len = strlen(action_str);

	/* make request msg */
	request.size_inc = 50;
	content_length = (off_t)(xml_start_len + action_str_len + xml_end_len);
	if (http_MakeMessage(&request,
		    1,
		    1,
		    "q"
		    "N"
		    "s"
		    "sssbsc"
		    "Uc"
		    "b"
		    "b"
		    "b",
		    SOAPMETHOD_POST,
		    &url,
		    content_length,
		    ContentTypeHeader,
		    "SOAPACTION: \"",
		    service_type,
		    "#",
		    name.buf,
		    name.length,
		    "\"",
		    xml_start,
		    xml_start_len,
		    action_str,
		    action_str_len,
		    xml_end,
		    xml_end_len) != 0) {
		goto error_handler;
	}

	ret_code = soap_request_and_response(&request, &url, &response);
	got_response = 1;
	if (ret_code != UPNP_E_SUCCESS) {
		err_code = ret_code;
		goto error_handler;
	}

	if (membuffer_append(&responsename, name.buf, name.length) != 0 ||
		membuffer_append_str(&responsename, "Response") != 0) {
		goto error_handler;
	}
	/* get action node from the response */
	ret_code = get_response_value(&response.msg,
		SOAP_ACTION_RESP,
		responsename.buf,
		&upnp_error_code,
		(IXML_Node **)response_node,
		&upnp_error_str);

	if (ret_code == SOAP_ACTION_RESP) {
		err_code = UPNP_E_SUCCESS;
	} else if (ret_code == SOAP_ACTION_RESP_ERROR) {
		err_code = upnp_error_code;
	} else {
		err_code = ret_code;
	}

error_handler:
	ixmlFreeDOMString(action_str);
	membuffer_destroy(&request);
	membuffer_destroy(&responsename);
	if (got_response) {
		httpmsg_destroy(&response.msg);
	}

	return err_code;
}